

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

string * __thiscall
Json::OurReader::normalizeEOL_abi_cxx11_
          (string *__return_storage_ptr__,OurReader *this,Location begin,Location end)

{
  char cVar1;
  OurReader *pOVar2;
  OurReader *pOStack_40;
  char c;
  Location current;
  Location end_local;
  Location begin_local;
  string *normalized;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pOStack_40 = this;
  while (pOStack_40 != (OurReader *)begin) {
    pOVar2 = (OurReader *)
             ((long)&(pOStack_40->nodes_).c.
                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                     super__Deque_impl_data._M_map + 1);
    cVar1 = *(char *)&(pOStack_40->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_map;
    if (cVar1 == '\r') {
      if ((pOVar2 != (OurReader *)begin) &&
         (*(char *)&(pOVar2->nodes_).c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map == '\n')) {
        pOVar2 = (OurReader *)
                 ((long)&(pOStack_40->nodes_).c.
                         super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                         super__Deque_impl_data._M_map + 2);
      }
      pOStack_40 = pOVar2;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
      pOStack_40 = pOVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING OurReader::normalizeEOL(OurReader::Location begin, OurReader::Location end) {
  JSONCPP_STRING normalized;
  normalized.reserve(static_cast<size_t>(end - begin));
  OurReader::Location current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') {
      if (current != end && *current == '\n')
         // convert dos EOL
         ++current;
      // convert Mac EOL
      normalized += '\n';
    } else {
      normalized += c;
    }
  }
  return normalized;
}